

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O1

void file_glob_symbol(t_file_handle *x,t_symbol *spattern)

{
  char cVar1;
  char *filename;
  _outlet *x_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  t_symbol *s;
  int in_EDX;
  ulong uVar8;
  t_atom outv [2];
  glob_t gg;
  stat_conflict sb;
  char pattern [1000];
  t_atom local_518;
  undefined4 local_508;
  float local_500;
  glob_t local_4f0;
  stat_conflict local_4a8;
  undefined4 local_418;
  
  do_expandpath(spattern->s_name,(char *)&local_418,in_EDX);
  sVar7 = strlen((char *)&local_418);
  cVar1 = *(char *)((long)&local_418 + (sVar7 - 1));
  bVar3 = true;
  if (((((short)local_418 != 0x2e) && (local_418._2_1_ != '\0' || (short)local_418 != 0x2f2e)) &&
      (iVar5 = str_endswith((char *)&local_418,"/."), iVar5 == 0)) &&
     (iVar5 = str_endswith((char *)&local_418,"/./"), iVar5 == 0)) {
    if (((local_418._2_1_ == '\0' && (short)local_418 == 0x2e2e) || (local_418 == 0x2f2e2e)) ||
       ((iVar5 = str_endswith((char *)&local_418,"/.."), iVar5 != 0 ||
        (iVar5 = str_endswith((char *)&local_418,"/../"), iVar5 != 0)))) {
      bVar4 = true;
      bVar3 = false;
      goto LAB_00180913;
    }
    bVar3 = false;
  }
  bVar4 = false;
LAB_00180913:
  iVar5 = glob((char *)&local_418,0,(__errfunc *)0x0,&local_4f0);
  if (iVar5 == 0) {
    if (local_4f0.gl_pathc != 0) {
      uVar8 = 0;
      do {
        filename = local_4f0.gl_pathv[uVar8];
        iVar5 = do_file_stat((t_file_handle *)0x0,filename,&local_4a8,(int *)0x0);
        bVar2 = (local_4a8.st_mode & 0xf000) == 0x4000;
        if ((cVar1 != '/') || (bVar2 && iVar5 == 0)) {
          sVar7 = strlen(filename);
          iVar6 = (int)sVar7 + -1;
          if (filename[iVar6] == '/') {
            filename[iVar6] = '\0';
          }
          if (((bVar3) ||
              ((iVar6 = strcmp(filename,"."), iVar6 != 0 &&
               (iVar6 = str_endswith(filename,"/."), iVar6 == 0)))) &&
             ((bVar4 || ((iVar6 = strcmp(filename,".."), iVar6 != 0 &&
                         (iVar6 = str_endswith(filename,"/.."), iVar6 == 0)))))) {
            local_518.a_w.w_symbol = gensym(filename);
            local_518.a_type = A_SYMBOL;
            local_500 = (float)(bVar2 && iVar5 == 0);
            local_508 = 1;
            x_00 = x->x_dataout;
            s = gensym("list");
            outlet_list(x_00,s,2,&local_518);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_4f0.gl_pathc);
    }
  }
  else {
    outlet_bang(x->x_infoout);
  }
  globfree(&local_4f0);
  return;
}

Assistant:

static void file_glob_symbol(t_file_handle*x, t_symbol*spattern) {
    t_atom outv[2];
    glob_t gg;
    int flags = 0;
    int matchdot=0;
    char pattern[MAXPDSTRING];
    size_t patternlen;
    int onlydirs;
    do_expandpath(spattern->s_name, pattern, MAXPDSTRING);
    patternlen=strlen(pattern);
    onlydirs = ('/' == pattern[patternlen-1]);
    if(!strcmp(".", pattern) || !strcmp("./", pattern)
        || str_endswith(pattern, "/.") || str_endswith(pattern, "/./"))
        matchdot=1;
    else if(!strcmp("..", pattern) || !strcmp("../", pattern)
        || str_endswith(pattern, "/..") || str_endswith(pattern, "/../"))
        matchdot=2;
    if(glob(pattern, flags, NULL, &gg)) {
            // this gets triggered if there is no match...
        outlet_bang(x->x_infoout);
    } else {
        size_t i;
        for(i=0; i<gg.gl_pathc; i++) {
            t_symbol *s;
            char*path = gg.gl_pathv[i];
            int isdir = 0;
            struct stat sb;
            int end;
            if(!do_file_stat(0, path, &sb, 0)) {
                isdir = S_ISDIR(sb.st_mode);
            }
            if(onlydirs && !isdir)
                continue;
            end=strlen(path);
            if('/' == path[end-1]) {
                path[end-1]=0;
            }
            if (matchdot!=1 && (!strcmp(path, ".") || str_endswith(path, "/.")))
                continue;
            if (matchdot!=2 && (!strcmp(path, "..") || str_endswith(path, "/..")))
                continue;

            s = gensym(path);
            SETSYMBOL(outv+0, s);
            SETFLOAT(outv+1, isdir);
            outlet_list(x->x_dataout, gensym("list"), 2, outv);
        }
    }
    globfree(&gg);
}